

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O3

vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_> *
__thiscall cmComputeLinkDepends::Compute(cmComputeLinkDepends *this)

{
  _Rb_tree_node_base *p_Var1;
  cmMakefile *this_00;
  pointer pcVar2;
  _Base_ptr p_Var3;
  BFSEntry qe;
  bool bVar4;
  PolicyStatus PVar5;
  int iVar6;
  _Elt_pointer pBVar7;
  cmComputeComponentGraph *this_01;
  cmValue cVar8;
  cmake *pcVar9;
  _Rb_tree_node_base *p_Var10;
  iterator __position;
  iterator r;
  cmGeneratorTarget *pcVar11;
  PolicyID id;
  PolicyID id_00;
  pointer puVar12;
  LinkEntry *__a;
  size_type sVar13;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  __begin0;
  pointer puVar14;
  SharedDepEntry *dep;
  _Base_ptr p_Var15;
  LinkEntry *pLVar16;
  long lVar17;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  __end0;
  value_type *__x;
  pointer __p;
  LinkEntry *__b;
  long lVar18;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  pair<std::_Rb_tree_iterator<unsigned_long>,_bool> pVar19;
  size_type __dnew;
  EntriesProcessing entriesProcessing;
  string errorMessage;
  RegularExpression processingOption;
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [40];
  char *local_3a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  _Base_ptr local_388;
  undefined1 local_380 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_350;
  cmGeneratorTarget *local_348;
  undefined1 local_340 [24];
  char local_328 [32];
  undefined1 local_308 [24];
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_2f0;
  _Base_ptr p_Stack_2c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2b8;
  size_t local_2b0;
  undefined1 local_2a8 [32];
  _Base_ptr local_288;
  size_t local_278;
  size_t sStack_270;
  _Base_ptr local_268;
  undefined1 local_260 [16];
  undefined1 local_250 [40];
  char *local_228;
  pointer local_220;
  char *local_158;
  __node_base local_150;
  _Base_ptr local_50;
  char *local_40;
  _Rb_tree_color local_38;
  
  AddDirectLinkEntries(this);
  pBVar7 = (this->BFSQueue).c.
           super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->BFSQueue).c.
      super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur != pBVar7) {
    do {
      local_268 = (_Base_ptr)pBVar7->LibDepends;
      local_278 = pBVar7->Index;
      sStack_270 = pBVar7->GroupIndex;
      std::deque<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>::
      pop_front(&(this->BFSQueue).c);
      qe.GroupIndex = sStack_270;
      qe.Index = local_278;
      qe.LibDepends = (char *)local_268;
      FollowLinkEntry(this,qe);
      pBVar7 = (this->BFSQueue).c.
               super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
    } while ((this->BFSQueue).c.
             super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur != pBVar7);
  }
  dep = (this->SharedDepQueue).c.
        super__Deque_base<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->SharedDepQueue).c.
      super__Deque_base<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur != dep) {
    do {
      HandleSharedDependency(this,dep);
      std::
      deque<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>
      ::pop_front(&(this->SharedDepQueue).c);
      dep = (this->SharedDepQueue).c.
            super__Deque_base<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
    } while ((this->SharedDepQueue).c.
             super__Deque_base<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur != dep);
  }
  InferDependencies(this);
  UpdateGroupDependencies(this);
  CleanConstraintGraph(this);
  if (this->DebugMode == true) {
    Compute(this);
  }
  this_01 = (cmComputeComponentGraph *)operator_new(0xe0);
  cmComputeComponentGraph::cmComputeComponentGraph(this_01,&this->EntryConstraintGraph);
  local_260._0_8_ =
       (__uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>)0x0;
  std::__uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>::
  reset((__uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_> *)
        &this->CCG,this_01);
  std::unique_ptr<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>::
  ~unique_ptr((unique_ptr<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_> *)
              local_260);
  cmComputeComponentGraph::Compute
            ((this->CCG)._M_t.
             super___uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmComputeComponentGraph_*,_std::default_delete<cmComputeComponentGraph>_>
             .super__Head_base<0UL,_cmComputeComponentGraph_*,_false>._M_head_impl);
  bVar4 = CheckCircularDependencies(this);
  if (!bVar4) {
    return &this->FinalLinkEntries;
  }
  OrderLinkEntries(this);
  pcVar11 = this->Target;
  local_308._8_8_ = &this->EntryList;
  local_308._16_8_ = &this->FinalLinkEntries;
  local_2f0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2f0._M_impl.super__Rb_tree_header._M_header;
  local_308._0_8_ = 0x100000001;
  local_2f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2f0._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Stack_2c0 = (_Base_ptr)0x0;
  this_00 = pcVar11->Makefile;
  local_2f0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2f0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_2a8._16_8_ = local_308._16_8_;
  PVar5 = cmPolicies::PolicyMap::Get(&pcVar11->PolicyMap,CMP0156);
  local_380._8_8_ = this;
  if (PVar5 - REQUIRED_IF_USED < 2) {
    pcVar9 = cmMakefile::GetCMakeInstance(this_00);
    cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)local_260,(cmPolicies *)0x9c,id);
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_3d8);
    cmake::IssueMessage(pcVar9,FATAL_ERROR,(string *)local_260,(cmListFileBacktrace *)local_3d8);
    if ((cmMakefile *)local_3d8._8_8_ != (cmMakefile *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d8._8_8_);
    }
    if ((cmComputeComponentGraph *)local_260._0_8_ != (cmComputeComponentGraph *)local_250) {
      operator_delete((void *)local_260._0_8_,(ulong)(local_250._0_8_ + 1));
    }
LAB_005606bc:
    local_260._0_8_ =
         (__uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>)
         0x6;
    local_260._8_8_ = "CMAKE_";
    local_250._0_8_ = (string *)0x0;
    local_250._16_8_ = (this->LinkLanguage)._M_dataplus._M_p;
    local_250._8_8_ = (this->LinkLanguage)._M_string_length;
    local_250._24_8_ = (pointer)0x0;
    local_250._32_8_ = 0x1a;
    local_228 = "_LINK_LIBRARIES_PROCESSING";
    local_220 = (pointer)0x0;
    views._M_len = 3;
    views._M_array = (iterator)local_260;
    cmCatViews((string *)local_3d8,views);
    cVar8 = cmMakefile::GetDefinition(this_00,(string *)local_3d8);
    if ((element_type *)local_3d8._0_8_ != (element_type *)local_3c8) {
      operator_delete((void *)local_3d8._0_8_,(ulong)(local_3c8._0_8_ + 1));
    }
    if (cVar8.Value != (string *)0x0) {
      local_50 = (_Base_ptr)0x0;
      local_40 = (char *)0x0;
      local_38 = _S_red;
      memset((RegularExpression *)local_260,0,0x20a);
      cmsys::RegularExpression::compile
                ((RegularExpression *)local_260,
                 "^(ORDER|UNICITY)=(FORWARD|REVERSE|ALL|NONE|SHARED)$");
      local_2b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8;
      local_2b0 = 0;
      local_2a8[0] = _S_red;
      pcVar2 = ((cVar8.Value)->_M_dataplus)._M_p;
      local_3d8._0_8_ = (element_type *)local_3c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_3d8,pcVar2,pcVar2 + (cVar8.Value)->_M_string_length);
      init._M_len = 1;
      init._M_array = (iterator)local_3d8;
      cmList::cmList((cmList *)(local_2a8 + 0x18),init);
      local_350._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00;
      local_348 = pcVar11;
      if ((element_type *)local_3d8._0_8_ != (element_type *)local_3c8) {
        operator_delete((void *)local_3d8._0_8_,(ulong)(local_3c8._0_8_ + 1));
      }
      if ((_Base_ptr)local_2a8._24_8_ != local_288) {
        p_Var15 = (_Base_ptr)local_2a8._24_8_;
        do {
          bVar4 = cmsys::RegularExpression::find
                            ((RegularExpression *)local_260,*(char **)p_Var15,
                             (RegularExpressionMatch *)local_260);
          if (bVar4) {
            if ((cmMakefile *)local_260._8_8_ == (cmMakefile *)0x0) {
              local_3d8._8_8_ = (cmMakefile *)0x0;
              local_3c8._0_8_ = local_3c8._0_8_ & 0xffffffffffffff00;
              local_3d8._0_8_ = (element_type *)local_3c8;
            }
            else {
              local_3d8._0_8_ = (element_type *)local_3c8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_3d8,local_260._8_8_,local_158);
            }
            iVar6 = std::__cxx11::string::compare((char *)local_3d8);
            if ((element_type *)local_3d8._0_8_ != (element_type *)local_3c8) {
              operator_delete((void *)local_3d8._0_8_,(ulong)(local_3c8._0_8_ + 1));
            }
            if (iVar6 == 0) {
              if ((string *)local_250._0_8_ == (string *)0x0) {
                local_3d8._8_8_ = (cmMakefile *)0x0;
                local_3c8._0_8_ = (ulong)(uint7)local_3c8._1_7_ << 8;
                local_3d8._0_8_ = (element_type *)local_3c8;
              }
              else {
                local_3d8._0_8_ = (element_type *)local_3c8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_3d8,local_250._0_8_,local_150._M_nxt);
              }
              iVar6 = std::__cxx11::string::compare((char *)local_3d8);
              if ((element_type *)local_3d8._0_8_ != (element_type *)local_3c8) {
                operator_delete((void *)local_3d8._0_8_,(ulong)(local_3c8._0_8_ + 1));
              }
              if (iVar6 == 0) {
                local_308._0_8_ = local_308._0_8_ & 0xffffffff00000000;
              }
              else {
                if ((string *)local_250._0_8_ == (string *)0x0) {
                  local_3d8._8_8_ = (cmMakefile *)0x0;
                  local_3c8._0_8_ = local_3c8._0_8_ & 0xffffffffffffff00;
                  local_3d8._0_8_ = (element_type *)local_3c8;
                }
                else {
                  local_3d8._0_8_ = (element_type *)local_3c8;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_3d8,local_250._0_8_,local_150._M_nxt);
                }
                iVar6 = std::__cxx11::string::compare((char *)local_3d8);
                if ((element_type *)local_3d8._0_8_ != (element_type *)local_3c8) {
                  operator_delete((void *)local_3d8._0_8_,(ulong)(local_3c8._0_8_ + 1));
                }
                if (iVar6 != 0) {
                  local_3d8._0_8_ = (element_type *)0x2;
                  local_3d8._8_8_ = "  ";
                  local_3c8._0_8_ = (cmLocalGenerator *)0x0;
                  local_3c8._16_8_ = *(undefined8 *)p_Var15;
                  local_3c8._8_8_ = p_Var15->_M_parent;
                  local_3c8._24_8_ = 0;
                  local_340._0_8_ = (element_type *)0x0;
                  local_340._8_8_ = (cmComputeComponentGraph *)0x1;
                  local_3a0 = local_328;
                  local_328[0] = '\n';
                  local_3c8._32_8_ = 1;
                  local_398._M_allocated_capacity = 0;
                  views_01._M_len = 3;
                  views_01._M_array = (iterator)local_3d8;
                  local_340._16_8_ = local_3a0;
                  cmCatViews((string *)(local_380 + 0x10),views_01);
                  std::__cxx11::string::_M_append((char *)&local_2b8,local_380._16_8_);
                  goto LAB_005608fd;
                }
                local_308._0_4_ = 1;
              }
            }
            else {
              if ((cmMakefile *)local_260._8_8_ == (cmMakefile *)0x0) {
                local_3d8._8_8_ = (cmMakefile *)0x0;
                local_3c8._0_8_ = (ulong)(uint7)local_3c8._1_7_ << 8;
                local_3d8._0_8_ = (element_type *)local_3c8;
              }
              else {
                local_3d8._0_8_ = (element_type *)local_3c8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_3d8,local_260._8_8_,local_158);
              }
              iVar6 = std::__cxx11::string::compare((char *)local_3d8);
              if ((element_type *)local_3d8._0_8_ != (element_type *)local_3c8) {
                operator_delete((void *)local_3d8._0_8_,(ulong)(local_3c8._0_8_ + 1));
              }
              if (iVar6 == 0) {
                if ((string *)local_250._0_8_ == (string *)0x0) {
                  local_3d8._8_8_ = (cmMakefile *)0x0;
                  local_3c8._0_8_ = local_3c8._0_8_ & 0xffffffffffffff00;
                  local_3d8._0_8_ = (element_type *)local_3c8;
                }
                else {
                  local_3d8._0_8_ = (element_type *)local_3c8;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_3d8,local_250._0_8_,local_150._M_nxt);
                }
                iVar6 = std::__cxx11::string::compare((char *)local_3d8);
                if ((element_type *)local_3d8._0_8_ != (element_type *)local_3c8) {
                  operator_delete((void *)local_3d8._0_8_,(ulong)(local_3c8._0_8_ + 1));
                }
                if (iVar6 == 0) {
                  local_308._4_4_ = 2;
                }
                else {
                  if ((string *)local_250._0_8_ == (string *)0x0) {
                    local_3d8._8_8_ = (cmMakefile *)0x0;
                    local_3c8._0_8_ = local_3c8._0_8_ & 0xffffffffffffff00;
                    local_3d8._0_8_ = (element_type *)local_3c8;
                  }
                  else {
                    local_3d8._0_8_ = (element_type *)local_3c8;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_3d8,local_250._0_8_,local_150._M_nxt);
                  }
                  iVar6 = std::__cxx11::string::compare((char *)local_3d8);
                  if ((element_type *)local_3d8._0_8_ != (element_type *)local_3c8) {
                    operator_delete((void *)local_3d8._0_8_,(ulong)(local_3c8._0_8_ + 1));
                  }
                  if (iVar6 == 0) {
                    local_308._0_8_ = local_308._0_8_ & 0xffffffff;
                  }
                  else {
                    if ((string *)local_250._0_8_ == (string *)0x0) {
                      local_3d8._8_8_ = (cmMakefile *)0x0;
                      local_3c8._0_8_ = local_3c8._0_8_ & 0xffffffffffffff00;
                      local_3d8._0_8_ = (element_type *)local_3c8;
                    }
                    else {
                      local_3d8._0_8_ = (element_type *)local_3c8;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_3d8,local_250._0_8_,local_150._M_nxt);
                    }
                    iVar6 = std::__cxx11::string::compare((char *)local_3d8);
                    if ((element_type *)local_3d8._0_8_ != (element_type *)local_3c8) {
                      operator_delete((void *)local_3d8._0_8_,(ulong)(local_3c8._0_8_ + 1));
                    }
                    if (iVar6 != 0) {
                      local_3d8._0_8_ = (element_type *)0x2;
                      local_3d8._8_8_ = "  ";
                      local_3c8._0_8_ = (cmLocalGenerator *)0x0;
                      local_3c8._16_8_ = *(undefined8 *)p_Var15;
                      local_3c8._8_8_ = p_Var15->_M_parent;
                      local_3c8._24_8_ = 0;
                      local_340._0_8_ = (element_type *)0x0;
                      local_340._8_8_ = (cmComputeComponentGraph *)0x1;
                      local_3a0 = local_328;
                      local_328[0] = '\n';
                      local_3c8._32_8_ = 1;
                      local_398._M_allocated_capacity = 0;
                      views_02._M_len = 3;
                      views_02._M_array = (iterator)local_3d8;
                      local_340._16_8_ = local_3a0;
                      cmCatViews((string *)(local_380 + 0x10),views_02);
                      std::__cxx11::string::_M_append((char *)&local_2b8,local_380._16_8_);
                      goto LAB_005608fd;
                    }
                    local_308._4_4_ = 1;
                  }
                }
              }
            }
          }
          else {
            local_3d8._0_8_ = (element_type *)0x2;
            local_3d8._8_8_ = "  ";
            local_3c8._0_8_ = (cmLocalGenerator *)0x0;
            local_3c8._16_8_ = *(undefined8 *)p_Var15;
            local_3c8._8_8_ = p_Var15->_M_parent;
            local_3c8._24_8_ = 0;
            local_340._0_8_ = (element_type *)0x0;
            local_340._8_8_ = (cmComputeComponentGraph *)0x1;
            local_3a0 = local_328;
            local_328[0] = '\n';
            local_3c8._32_8_ = 1;
            local_398._M_allocated_capacity = 0;
            views_00._M_len = 3;
            views_00._M_array = (iterator)local_3d8;
            local_340._16_8_ = local_3a0;
            cmCatViews((string *)(local_380 + 0x10),views_00);
            std::__cxx11::string::_M_append((char *)&local_2b8,local_380._16_8_);
LAB_005608fd:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_380._16_8_ != &local_360) {
              operator_delete((void *)local_380._16_8_,local_360._M_allocated_capacity + 1);
            }
          }
          p_Var15 = p_Var15 + 1;
        } while (p_Var15 != local_288);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2a8 + 0x18));
      this = (cmComputeLinkDepends *)local_380._8_8_;
      if (local_2b0 != 0) {
        pcVar9 = cmMakefile::GetCMakeInstance((cmMakefile *)local_350._M_pi);
        local_3d8._0_8_ = (element_type *)0x1f;
        local_3d8._8_8_ = "Erroneous option(s) for \'CMAKE_";
        local_3c8._0_8_ = (cmLocalGenerator *)0x0;
        local_3c8._16_8_ = (((string *)((long)this + 0x20))->_M_dataplus)._M_p;
        local_3c8._8_8_ = *(size_type *)((long)this + 0x28);
        local_3c8._24_8_ = 0;
        local_3c8._32_8_ = 0x1d;
        local_3a0 = "_LINK_LIBRARIES_PROCESSING\':\n";
        local_398._M_allocated_capacity = 0;
        local_398._8_8_ = local_2b0;
        local_388 = (_Base_ptr)local_2b8._M_pi;
        local_380._0_8_ = (pointer)0x0;
        views_03._M_len = 4;
        views_03._M_array = (iterator)local_3d8;
        cmCatViews((string *)local_340,views_03);
        cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_3d8);
        cmake::IssueMessage(pcVar9,FATAL_ERROR,(string *)local_340,(cmListFileBacktrace *)local_3d8)
        ;
        if ((cmMakefile *)local_3d8._8_8_ != (cmMakefile *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d8._8_8_);
        }
        if ((element_type *)local_340._0_8_ != (element_type *)(local_340 + 0x10)) {
          operator_delete((void *)local_340._0_8_,(ulong)(local_340._16_8_ + 1));
        }
      }
      if ((_Base_ptr)local_2b8._M_pi != (_Base_ptr)local_2a8) {
        operator_delete(local_2b8._M_pi,CONCAT71(local_2a8._1_7_,local_2a8[0]) + 1);
      }
      if (local_40 != (char *)0x0) {
        operator_delete__(local_40);
      }
    }
  }
  else if (PVar5 == WARN) {
    pcVar9 = cmMakefile::GetCMakeInstance(this_00);
    bVar4 = cmake::GetIsInTryCompile(pcVar9);
    if (!bVar4) {
      local_3d8._0_8_ = &DAT_0000001c;
      local_260._0_8_ = local_250;
      local_260._0_8_ = std::__cxx11::string::_M_create((ulong *)local_260,(ulong)local_3d8);
      local_250._0_8_ = local_3d8._0_8_;
      builtin_strncpy((char *)(local_260._0_8_ + 0xc),"_WARNING",8);
      builtin_strncpy((char *)(local_260._0_8_ + 0x14),"_CMP0156",8);
      *(undefined8 *)local_260._0_8_ = 0x4f505f454b414d43;
      (((Graph *)(local_260._0_8_ + 8))->
      super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
      super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x5241575f5943494c;
      local_260._8_8_ = local_3d8._0_8_;
      *(char *)(local_3d8._0_8_ + local_260._0_8_) = '\0';
      bVar4 = cmMakefile::PolicyOptionalWarningEnabled(this_00,(string *)local_260);
      if ((undefined1 *)local_260._0_8_ != local_250) {
        operator_delete((void *)local_260._0_8_,(ulong)(local_250._0_8_ + 1));
      }
      if (bVar4) {
        pcVar9 = cmMakefile::GetCMakeInstance(this_00);
        cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_340,(cmPolicies *)0x9c,id_00);
        local_260._0_8_ = local_340._8_8_;
        local_260._8_8_ = local_340._0_8_;
        local_250._8_8_ = 0x57;
        local_250._16_8_ =
             "\nSince the policy is not set, legacy libraries de-duplication strategy will be applied."
        ;
        local_250._24_8_ = (pointer)0x0;
        views_04._M_len = 2;
        views_04._M_array = (iterator)local_260;
        local_250._0_8_ = (string *)local_340;
        cmCatViews((string *)local_3d8,views_04);
        cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_260);
        cmake::IssueMessage(pcVar9,AUTHOR_WARNING,(string *)local_3d8,
                            (cmListFileBacktrace *)local_260);
        if ((cmMakefile *)local_260._8_8_ != (cmMakefile *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_260._8_8_);
        }
        if ((element_type *)local_3d8._0_8_ != (element_type *)local_3c8) {
          operator_delete((void *)local_3d8._0_8_,(ulong)(local_3c8._0_8_ + 1));
        }
        if ((element_type *)local_340._0_8_ != (element_type *)(local_340 + 0x10)) {
          operator_delete((void *)local_340._0_8_,(ulong)(local_340._16_8_ + 1));
        }
      }
    }
  }
  else if (PVar5 == NEW) goto LAB_005606bc;
  if ((this->GroupItems)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    p_Stack_2c0 = (_Base_ptr)(local_380._8_8_ + 0xf0);
    p_Var10 = *(_Base_ptr *)(local_380._8_8_ + 0x108);
    p_Var1 = (_Rb_tree_node_base *)(local_380._8_8_ + 0xf8);
    if (p_Var10 != p_Var1) {
      do {
        p_Var3 = p_Var10[1]._M_left;
        for (p_Var15 = p_Var10[1]._M_parent; p_Var15 != p_Var3;
            p_Var15 = (_Base_ptr)&p_Var15->_M_parent) {
          local_260._0_8_ = *(undefined8 *)p_Var15;
          std::
          _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
          ::_M_insert_unique<unsigned_long_const&>
                    ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                      *)&local_2f0,(unsigned_long *)local_260);
        }
        p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
      } while (p_Var10 != p_Var1);
    }
  }
  puVar12 = (((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_380._8_8_ + 0x288))->
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar14 = *(pointer *)(local_380._8_8_ + 0x290);
  if (local_308._0_4_ == Reverse) {
    if (puVar14 == puVar12) {
      puVar12 = (((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_380._8_8_ + 0x2e8)
                 )->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start;
      puVar14 = *(pointer *)(local_380._8_8_ + 0x2f0);
    }
    else {
      do {
        local_260._0_8_ = puVar14[-1];
        pLVar16 = (((_Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                     *)local_308._8_8_)->_M_impl).super__Vector_impl_data._M_start + local_260._0_8_
        ;
        bVar4 = anon_unknown.dwarf_242aa0c::EntriesProcessing::IncludeEntry
                          ((EntriesProcessing *)local_308,pLVar16);
        if ((bVar4) ||
           (pVar19 = std::
                     _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                     ::_M_insert_unique<unsigned_long_const&>
                               ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                                 *)&local_2f0,(unsigned_long *)local_260),
           ((undefined1  [16])pVar19 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
          std::
          vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>::
          emplace_back<cmComputeLinkDepends::LinkEntry_const&>
                    ((vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>
                      *)local_308._16_8_,pLVar16);
        }
        puVar14 = puVar14 + -1;
      } while (puVar14 != puVar12);
LAB_005611df:
      puVar12 = (((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_380._8_8_ + 0x2e8)
                 )->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start;
      puVar14 = *(pointer *)(local_380._8_8_ + 0x2f0);
      if (local_308._0_4_ != Reverse) goto LAB_0056127d;
    }
    for (; puVar14 != puVar12; puVar14 = puVar14 + -1) {
      std::vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>::
      emplace_back<cmComputeLinkDepends::LinkEntry&>
                ((vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>
                  *)local_308._16_8_,
                 (((_Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                    *)local_308._8_8_)->_M_impl).super__Vector_impl_data._M_start + puVar14[-1]);
    }
  }
  else {
    if (puVar12 != puVar14) {
      do {
        local_260._0_8_ = *puVar12;
        pLVar16 = (((_Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                     *)local_308._8_8_)->_M_impl).super__Vector_impl_data._M_start + local_260._0_8_
        ;
        bVar4 = anon_unknown.dwarf_242aa0c::EntriesProcessing::IncludeEntry
                          ((EntriesProcessing *)local_308,pLVar16);
        if ((bVar4) ||
           (pVar19 = std::
                     _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                     ::_M_insert_unique<unsigned_long_const&>
                               ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                                 *)&local_2f0,(unsigned_long *)local_260),
           ((undefined1  [16])pVar19 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
          std::
          vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>::
          emplace_back<cmComputeLinkDepends::LinkEntry_const&>
                    ((vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>
                      *)local_308._16_8_,pLVar16);
        }
        puVar12 = puVar12 + 1;
      } while (puVar12 != puVar14);
      goto LAB_005611df;
    }
    puVar12 = (((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_380._8_8_ + 0x2e8))
              ->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start;
    puVar14 = *(pointer *)(local_380._8_8_ + 0x2f0);
LAB_0056127d:
    for (; puVar14 != puVar12; puVar14 = puVar14 + -1) {
      std::vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>::
      _M_emplace_aux<cmComputeLinkDepends::LinkEntry&>
                ((vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>
                  *)local_308._16_8_,*(LinkEntry **)local_308._16_8_,
                 (((_Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                    *)local_308._8_8_)->_M_impl).super__Vector_impl_data._M_start + puVar14[-1]);
    }
  }
  if (local_308._0_4_ == Reverse) {
    __a = *(LinkEntry **)local_308._16_8_;
    __b = *(LinkEntry **)(local_308._16_8_ + 8) + -1;
    if (__a < __b && __a != *(LinkEntry **)(local_308._16_8_ + 8)) {
      do {
        std::swap<cmComputeLinkDepends::LinkEntry>(__a,__b);
        __a = __a + 1;
        __b = __b + -1;
      } while (__a < __b);
    }
  }
  if (p_Stack_2c0 != (_Base_ptr)0x0) {
    pcVar11 = (cmGeneratorTarget *)p_Stack_2c0->_M_right;
    local_348 = (cmGeneratorTarget *)&p_Stack_2c0->_M_parent;
    p_Var15 = (_Base_ptr)local_308._16_8_;
    if (pcVar11 != local_348) {
LAB_005612ff:
      __x = (((_Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
               *)local_308._8_8_)->_M_impl).super__Vector_impl_data._M_start +
            (long)(pcVar11->ObjectDirectory)._M_dataplus._M_p;
      r._M_current = *(LinkEntry **)p_Var15;
      do {
        local_350._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var15->_M_parent;
        lVar18 = (long)local_350._M_pi - (long)r._M_current;
        lVar17 = (lVar18 >> 3) * 0x4ec4ec4ec4ec4ec5 >> 2;
        if (0 < lVar17) {
          lVar17 = lVar17 + 1;
          do {
            bVar4 = ::operator==(&__x->Item,&(r._M_current)->Item);
            __position._M_current = r._M_current;
            if (bVar4) goto LAB_00561429;
            __position._M_current =
                 (LinkEntry *)
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&(((cmMakefile *)r._M_current)->CMP0054ReportedIds)._M_t._M_impl.
                      super__Rb_tree_header + 1);
            bVar4 = ::operator==(&__x->Item,
                                 (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)__position._M_current);
            if (bVar4) goto LAB_00561429;
            __position._M_current =
                 (LinkEntry *)
                 &(((cmMakefile *)r._M_current)->AliasTargets)._M_t._M_impl.super__Rb_tree_header.
                  _M_header._M_left;
            bVar4 = ::operator==(&__x->Item,
                                 (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)__position._M_current);
            if (bVar4) goto LAB_00561429;
            __position._M_current =
                 (LinkEntry *)
                 &(((cmMakefile *)r._M_current)->SourceFileSearchIndex)._M_h._M_rehash_policy;
            bVar4 = ::operator==(&__x->Item,
                                 (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)__position._M_current);
            if (bVar4) goto LAB_00561429;
            r._M_current = (LinkEntry *)
                           &(((cmMakefile *)r._M_current)->Tests)._M_t._M_impl.super__Rb_tree_header
                            ._M_header._M_left;
            lVar17 = lVar17 + -1;
            lVar18 = lVar18 + -0x1a0;
          } while (1 < lVar17);
        }
        lVar17 = (lVar18 >> 3) * 0x4ec4ec4ec4ec4ec5;
        if (lVar17 == 1) {
LAB_00561410:
          bVar4 = ::operator==(&__x->Item,&(r._M_current)->Item);
          __position._M_current = (LinkEntry *)local_350._M_pi;
          if (bVar4) {
            __position._M_current = r._M_current;
          }
        }
        else if (lVar17 == 2) {
LAB_005613ee:
          bVar4 = ::operator==(&__x->Item,&(r._M_current)->Item);
          __position._M_current = r._M_current;
          if (!bVar4) {
            r._M_current = (LinkEntry *)
                           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)&(((cmMakefile *)r._M_current)->CMP0054ReportedIds)._M_t._M_impl.
                                super__Rb_tree_header + 1);
            goto LAB_00561410;
          }
        }
        else {
          __position._M_current = (LinkEntry *)local_350._M_pi;
          if ((lVar17 == 3) &&
             (bVar4 = ::operator==(&__x->Item,&(r._M_current)->Item),
             __position._M_current = r._M_current, !bVar4)) {
            r._M_current = (LinkEntry *)
                           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)&(((cmMakefile *)r._M_current)->CMP0054ReportedIds)._M_t._M_impl.
                                super__Rb_tree_header + 1);
            goto LAB_005613ee;
          }
        }
LAB_00561429:
        p_Var15 = (_Base_ptr)local_308._16_8_;
        if ((cmMakefile *)__position._M_current == *(cmMakefile **)(local_308._16_8_ + 8))
        goto LAB_005614c7;
        std::__cxx11::string::_M_replace
                  ((ulong)__position._M_current,0,
                   (char *)(((cmMakefile *)__position._M_current)->FindPackageRootPathStack).
                           super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_map_size,0x7d2a4e);
        for (sVar13 = (pcVar11->ObjectDirectory).field_2._M_allocated_capacity;
            sVar13 != (pcVar11->ObjectDirectory)._M_string_length; sVar13 = sVar13 - 8) {
          __position = std::
                       vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                       ::insert((vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                                 *)local_308._16_8_,__position._M_current,
                                (((_Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                                   *)local_308._8_8_)->_M_impl).super__Vector_impl_data._M_start +
                                *(long *)(sVar13 - 8));
        }
        r = std::
            vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
            ::insert((vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                      *)local_308._16_8_,__position._M_current,__x);
        std::__cxx11::string::_M_replace
                  ((ulong)r._M_current,0,(char *)((r._M_current)->Item).Value._M_string_length,
                   0x7d2a5c);
        p_Var15 = (_Base_ptr)local_308._16_8_;
      } while( true );
    }
  }
LAB_005614e0:
  if (*(bool *)(local_380._8_8_ + 0x30d) == true) {
    DisplayFinalEntries((cmComputeLinkDepends *)local_380._8_8_);
  }
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&local_2f0);
  return (vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
          *)(_Base_ptr)local_2a8._16_8_;
LAB_005614c7:
  pcVar11 = (cmGeneratorTarget *)std::_Rb_tree_increment((_Rb_tree_node_base *)pcVar11);
  if (pcVar11 == local_348) goto LAB_005614e0;
  goto LAB_005612ff;
}

Assistant:

std::vector<cmComputeLinkDepends::LinkEntry> const&
cmComputeLinkDepends::Compute()
{
  // Follow the link dependencies of the target to be linked.
  this->AddDirectLinkEntries();

  // Complete the breadth-first search of dependencies.
  while (!this->BFSQueue.empty()) {
    // Get the next entry.
    BFSEntry qe = this->BFSQueue.front();
    this->BFSQueue.pop();

    // Follow the entry's dependencies.
    this->FollowLinkEntry(qe);
  }

  // Complete the search of shared library dependencies.
  while (!this->SharedDepQueue.empty()) {
    // Handle the next entry.
    this->HandleSharedDependency(this->SharedDepQueue.front());
    this->SharedDepQueue.pop();
  }

  // Infer dependencies of targets for which they were not known.
  this->InferDependencies();

  // finalize groups dependencies
  // All dependencies which are raw items must be replaced by the group
  // it belongs to, if any.
  this->UpdateGroupDependencies();

  // Cleanup the constraint graph.
  this->CleanConstraintGraph();

  // Display the constraint graph.
  if (this->DebugMode) {
    fprintf(stderr,
            "---------------------------------------"
            "---------------------------------------\n");
    fprintf(stderr, "Link dependency analysis for target %s, config %s\n",
            this->Target->GetName().c_str(),
            this->HasConfig ? this->Config.c_str() : "noconfig");
    this->DisplayConstraintGraph();
  }

  // Compute the DAG of strongly connected components.  The algorithm
  // used by cmComputeComponentGraph should identify the components in
  // the same order in which the items were originally discovered in
  // the BFS.  This should preserve the original order when no
  // constraints disallow it.
  this->CCG =
    cm::make_unique<cmComputeComponentGraph>(this->EntryConstraintGraph);
  this->CCG->Compute();

  if (!this->CheckCircularDependencies()) {
    return this->FinalLinkEntries;
  }

  // Compute the final ordering.
  this->OrderLinkEntries();

  // Compute the final set of link entries.
  EntriesProcessing entriesProcessing{ this->Target, this->LinkLanguage,
                                       this->EntryList,
                                       this->FinalLinkEntries };
  // Add groups first, to ensure that libraries of the groups are always kept.
  entriesProcessing.AddGroups(this->GroupItems);
  entriesProcessing.AddLibraries(this->FinalLinkOrder);
  entriesProcessing.AddObjects(this->ObjectEntries);
  entriesProcessing.Finalize();

  // Display the final set.
  if (this->DebugMode) {
    this->DisplayFinalEntries();
  }

  return this->FinalLinkEntries;
}